

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O0

void __thiscall Omega_h::Parents::~Parents(Parents *this)

{
  Parents *this_local;
  
  Read<signed_char>::~Read(&this->codes);
  Read<int>::~Read(&this->parent_idx);
  return;
}

Assistant:

OMEGA_H_INLINE Parents() {}